

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckms_quantiles.cc
# Opt level: O3

bool __thiscall prometheus::detail::CKMSQuantiles::insertBatch(CKMSQuantiles *this)

{
  array<double,_500UL> *__args;
  pointer pIVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  size_t i;
  ulong uVar9;
  ulong uVar10;
  double *pdVar11;
  bool bVar12;
  double dVar13;
  double v;
  int local_48 [2];
  double local_40;
  size_t local_38;
  
  local_38 = this->buffer_count_;
  if (local_38 != 0) {
    __args = &this->buffer_;
    pdVar11 = (this->buffer_)._M_elems + local_38;
    uVar4 = (long)(local_38 * 8) >> 3;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::__introsort_loop<double*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (__args,pdVar11,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<double*,__gnu_cxx::__ops::_Iter_less_iter>(__args,pdVar11);
    bVar12 = (this->sample_).
             super__Vector_base<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (this->sample_).
             super__Vector_base<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (bVar12) {
      local_40 = (double)CONCAT44(local_40._4_4_,1);
      local_48[0] = 0;
      std::
      vector<prometheus::detail::CKMSQuantiles::Item,std::allocator<prometheus::detail::CKMSQuantiles::Item>>
      ::emplace_back<double&,int,int>
                ((vector<prometheus::detail::CKMSQuantiles::Item,std::allocator<prometheus::detail::CKMSQuantiles::Item>>
                  *)&this->sample_,__args->_M_elems,(int *)&local_40,local_48);
      this->count_ = this->count_ + 1;
    }
    uVar4 = (ulong)bVar12;
    if (uVar4 < this->buffer_count_) {
      uVar7 = 1;
      uVar10 = 0;
      do {
        local_40 = (this->buffer_)._M_elems[uVar4];
        pIVar1 = (this->sample_).
                 super__Vector_base<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = (long)(this->sample_).
                      super__Vector_base<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar1 >> 4;
        if (uVar7 < uVar5) {
          uVar3 = uVar7;
          uVar9 = uVar10;
          do {
            uVar8 = uVar3;
            uVar7 = uVar8;
            uVar10 = uVar9;
            if (local_40 < pIVar1[uVar9].value || local_40 == pIVar1[uVar9].value) break;
            uVar7 = uVar5;
            uVar3 = uVar8 + 1;
            uVar10 = uVar5 - 1;
            uVar9 = uVar8;
          } while (uVar5 != uVar8 + 1);
        }
        uVar10 = uVar7 - (local_40 < pIVar1[uVar10].value);
        uVar7 = 2;
        iVar6 = 0;
        if ((uVar10 != 1) && (uVar7 = uVar10 + 1, iVar6 = 0, uVar7 != uVar5)) {
          dVar13 = allowableError(this,(int)uVar7);
          dVar13 = floor(dVar13);
          iVar6 = (int)dVar13 + 1;
        }
        local_48[1] = 1;
        local_48[0] = iVar6;
        std::
        vector<prometheus::detail::CKMSQuantiles::Item,std::allocator<prometheus::detail::CKMSQuantiles::Item>>
        ::_M_emplace_aux<double&,int,int&>
                  ((vector<prometheus::detail::CKMSQuantiles::Item,std::allocator<prometheus::detail::CKMSQuantiles::Item>>
                    *)&this->sample_,pIVar1 + uVar10,&local_40,local_48 + 1,local_48);
        this->count_ = this->count_ + 1;
        uVar4 = uVar4 + 1;
      } while (uVar4 < this->buffer_count_);
    }
    this->buffer_count_ = 0;
  }
  return local_38 != 0;
}

Assistant:

bool CKMSQuantiles::insertBatch() {
  if (buffer_count_ == 0) {
    return false;
  }

  std::sort(buffer_.begin(), buffer_.begin() + buffer_count_);

  std::size_t start = 0;
  if (sample_.empty()) {
    sample_.emplace_back(buffer_[0], 1, 0);
    ++start;
    ++count_;
  }

  std::size_t idx = 0;
  std::size_t item = idx++;

  for (std::size_t i = start; i < buffer_count_; ++i) {
    double v = buffer_[i];
    while (idx < sample_.size() && sample_[item].value < v) {
      item = idx++;
    }

    if (sample_[item].value > v) {
      --idx;
    }

    int delta;
    if (idx - 1 == 0 || idx + 1 == sample_.size()) {
      delta = 0;
    } else {
      delta = static_cast<int>(std::floor(allowableError(idx + 1))) + 1;
    }

    sample_.emplace(sample_.begin() + idx, v, 1, delta);
    count_++;
    item = idx++;
  }

  buffer_count_ = 0;
  return true;
}